

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O2

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  Value *pVVar2;
  undefined4 in_register_00000034;
  allocator<char> local_39;
  string local_38;
  
  pVVar2 = Scope::lookup((this->scope_)._M_t.
                         super___uniq_ptr_impl<flow::lang::IRGenerator::Scope,_std::default_delete<flow::lang::IRGenerator::Scope>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_flow::lang::IRGenerator::Scope_*,_std::default_delete<flow::lang::IRGenerator::Scope>_>
                         .super__Head_base<0UL,_flow::lang::IRGenerator::Scope_*,_false>.
                         _M_head_impl,*(Symbol **)(CONCAT44(in_register_00000034,__fd) + 0x40));
  if (pVVar2 == (Value *)0x0) {
    this->result_ = (Value *)0x0;
    iVar1 = 0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
    pVVar2 = IRBuilder::createLoad(&this->super_IRBuilder,pVVar2,&local_38);
    this->result_ = pVVar2;
    iVar1 = std::__cxx11::string::~string((string *)&local_38);
  }
  return iVar1;
}

Assistant:

void IRGenerator::accept(VariableExpr& expr) {
  // loads the value of the given variable

  if (auto var = scope().lookup(expr.variable())) {
    result_ = createLoad(var);
  } else {
    result_ = nullptr;
  }
}